

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O3

void vocwset(voccxdef *ctx,vocdef *v,prpnum p,objnum objn,int classflg)

{
  uchar uVar1;
  long lVar2;
  uint uVar3;
  vocwdef *pvVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  vocwdef *pvVar8;
  
  uVar6 = v->vocwlst;
  if (uVar6 != 0xffffffff) {
    lVar2 = *(long *)((long)ctx->voccxwp + (ulong)(uVar6 / 0xfa & 0xfffffff8));
    if (lVar2 != 0) {
      pvVar4 = (vocwdef *)(lVar2 + (ulong)(uVar6 % 2000) * 8);
      do {
        if ((((pvVar4->vocwflg & 8) != 0) && (pvVar4->vocwobj == objn)) && (pvVar4->vocwtyp == p)) {
          pvVar4->vocwflg = pvVar4->vocwflg & 0xf7;
          return;
        }
        uVar3 = pvVar4->vocwnxt;
      } while ((uVar3 != 0xffffffff) &&
              (pvVar4 = ctx->voccxwp[(ulong)uVar3 / 2000] + uVar3 % 2000,
              ctx->voccxwp[(ulong)uVar3 / 2000] != (vocwdef *)0x0));
      if (uVar6 == 0xffffffff) goto LAB_0013715e;
    }
    if (ctx->voccxwp[(ulong)uVar6 / 2000] != (vocwdef *)0x0) {
      pvVar4 = ctx->voccxwp[(ulong)uVar6 / 2000] + uVar6 % 2000;
      do {
        if (((pvVar4->vocwobj == objn) && (pvVar4->vocwtyp == p)) &&
           ((classflg & 1U) == (pvVar4->vocwflg & 1))) {
          return;
        }
        uVar6 = pvVar4->vocwnxt;
      } while ((uVar6 != 0xffffffff) &&
              (pvVar4 = ctx->voccxwp[(ulong)uVar6 / 2000] + uVar6 % 2000,
              ctx->voccxwp[(ulong)uVar6 / 2000] != (vocwdef *)0x0));
    }
  }
LAB_0013715e:
  uVar6 = ctx->voccxwfre;
  if (uVar6 == 0xffffffff) {
    uVar6 = ctx->voccxwalocnt;
    uVar7 = (ulong)uVar6;
    uVar3 = uVar6 % 2000;
    if (uVar3 == 0) {
      if (31999 < uVar6) {
        errsigf(ctx->voccxerr,"TADS",0x1c3);
      }
      pvVar4 = (vocwdef *)mchalo(ctx->voccxerr,16000,"vocwset");
      ctx->voccxwp[(uint)((uVar7 & 0xffff) >> 4) / 0x7d] = pvVar4;
      uVar7 = (ulong)ctx->voccxwalocnt;
      uVar3 = ctx->voccxwalocnt % 2000;
    }
    uVar6 = (uint)uVar7;
    ctx->voccxwalocnt = uVar6 + 1;
    pvVar4 = (vocwdef *)
             ((ulong)uVar3 * 8 +
             *(long *)((long)ctx->voccxwp + (ulong)((uint)(uVar7 / 0xfa) & 0xfffffff8)));
  }
  else {
    pvVar4 = ctx->voccxwp[(ulong)uVar6 / 2000] + uVar6 % 2000;
    ctx->voccxwfre = pvVar4->vocwnxt;
  }
  pvVar4->vocwnxt = v->vocwlst;
  v->vocwlst = uVar6;
  pvVar4->vocwtyp = (uchar)p;
  pvVar4->vocwobj = objn;
  pvVar4->vocwflg = (uchar)classflg;
  if ((((p == 2) && ((classflg & 1U) == 0)) && ((ctx->voccxflg & 2) != 0)) &&
     ((uVar6 = v->vocwlst, uVar6 != 0xffffffff &&
      (ctx->voccxwp[(ulong)uVar6 / 2000] != (vocwdef *)0x0)))) {
    pvVar8 = ctx->voccxwp[(ulong)uVar6 / 2000] + uVar6 % 2000;
    do {
      if (((pvVar8 != pvVar4) && ((pvVar8->vocwflg & 1) == 0)) && (pvVar8->vocwtyp == '\x02')) {
        uVar1 = v->vocln2;
        pcVar5 = errstr(ctx->voccxerr,(char *)v->voctxt,(uint)v->voclen);
        ctx->voccxerr->errcxptr->erraav[0].errastr = pcVar5;
        if (uVar1 == '\0') {
          ctx->voccxerr->errcxptr->erraac = 1;
        }
        else {
          pcVar5 = errstr(ctx->voccxerr,(char *)(v->voctxt + v->voclen),(uint)v->vocln2);
          ctx->voccxerr->errcxptr->erraav[1].errastr = pcVar5;
          ctx->voccxerr->errcxptr->erraac = 2;
        }
        errlogn(ctx->voccxerr,0x1c4,"TADS");
        return;
      }
      uVar6 = pvVar8->vocwnxt;
    } while ((uVar6 != 0xffffffff) &&
            (pvVar8 = ctx->voccxwp[(ulong)uVar6 / 2000] + uVar6 % 2000,
            ctx->voccxwp[(ulong)uVar6 / 2000] != (vocwdef *)0x0));
  }
  return;
}

Assistant:

static void vocwset(voccxdef *ctx, vocdef *v, prpnum p, objnum objn,
                    int classflg)
{
    vocwdef *vw;
    uint     inx;
    vocwdef *vw2;

    /*
     *   look through the vocdef list to see if there's an existing entry
     *   with the DELETED marker -- if so, simply undelete it 
     */
    for (inx = v->vocwlst, vw = vocwget(ctx, inx) ; vw ;
         inx = vw->vocwnxt, vw = vocwget(ctx, inx))
    {
        /* if this entry was deleted, and otherwise matches, undelete it */
        if ((vw->vocwflg & VOCFDEL)
            && vw->vocwobj == objn && vw->vocwtyp == p)
        {
            /*
             *   Remove the deleted flag.  We will otherwise leave the
             *   flags unchanged, since the VOCFDEL flag applies only to
             *   statically allocated objects, and hence the original
             *   flags should take precedence over any run-time flags. 
             */
            vw->vocwflg &= ~VOCFDEL;

            /* we're done */
            return;
        }
    }

    /* make sure the word+object+type record isn't already defined */
    for (inx = v->vocwlst, vw = vocwget(ctx, inx) ; vw ;
         inx = vw->vocwnxt, vw = vocwget(ctx, inx))
    {
        if (vw->vocwobj == objn && vw->vocwtyp == p
            && (vw->vocwflg & VOCFCLASS) == (classflg & VOCFCLASS))
        {
            /* it matches - don't add a redundant record */
            return;
        }
    }
    
    /* look in the free list for an available vocwdef */
    if (ctx->voccxwfre != VOCCXW_NONE)
    {
        inx = ctx->voccxwfre;
        vw = vocwget(ctx, inx);                     /* get the free vocwdef */
        ctx->voccxwfre = vw->vocwnxt;              /* unlink from free list */
    }
    else
    {
        /* allocate another page of vocwdef's if necssary */
        if ((ctx->voccxwalocnt % VOCWPGSIZ) == 0)
        {
            int pg = ctx->voccxwalocnt / VOCWPGSIZ;
            
            /* make sure we haven't exceeded the available page count */
            if (pg >= VOCWPGMAX) errsig(ctx->voccxerr, ERR_VOCMNPG);
            
            /* allocate on the new page */
#ifdef VOCW_IN_CACHE
            mcmalo(ctx->voccxmem, (ushort)(VOCWPGSIZ * sizeof(vocwdef)),
                                           &ctx->voccxwp[pg]);
            mcmunlck(ctx->voccxmem, ctx->voccxwp[pg]);
#else
            ctx->voccxwp[pg] =
                (vocwdef *)mchalo(ctx->voccxerr,
                                  (VOCWPGSIZ * sizeof(vocwdef)),
                                  "vocwset");
#endif
        }

        /* get the next entry, and increment count of used entries */
        inx = ctx->voccxwalocnt++;
        vw = vocwget(ctx, inx);
    }

    /* link the new vocwdef into the vocdef's relation list */
    vw->vocwnxt = v->vocwlst;
    v->vocwlst = inx;

    /* set up the new vocwdef */
    vw->vocwtyp = (uchar)p;
    vw->vocwobj = objn;
    vw->vocwflg = classflg;

    /* 
     *   Scan the list and make sure we're not adding a redundant verb.
     *   Don't bother with the warning if this is a class. 
     */
    if (p == PRP_VERB && (ctx->voccxflg & VOCCXFVWARN)
        && (vw->vocwflg & VOCFCLASS) == 0)
    {
        for (vw2 = vocwget(ctx, v->vocwlst) ; vw2 ;
             vw2 = vocwget(ctx, vw2->vocwnxt))
        {
            /* 
             *   if this is a different object, and it's not a class, and
             *   it's defined as a verb, warn about it 
             */
            if (vw2 != vw
                && (vw2->vocwflg & VOCFCLASS) == 0
                && vw2->vocwtyp == PRP_VERB)
            {
                if (v->vocln2 != 0)
                    errlog2(ctx->voccxerr, ERR_VOCREVB,
                            ERRTSTR,
                            errstr(ctx->voccxerr,
                                   (char *)v->voctxt, v->voclen),
                            ERRTSTR,
                            errstr(ctx->voccxerr,
                                   (char *)v->voctxt + v->voclen, v->vocln2));
                else
                    errlog1(ctx->voccxerr, ERR_VOCREVB,
                            ERRTSTR,
                            errstr(ctx->voccxerr,
                                   (char *)v->voctxt, v->voclen));
                break;
            }
        }
    }
}